

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O3

string * StringBuilder<int,char_const(&)[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
                   (string *__return_storage_ptr__,int *arg,char (*args) [5],int *args_1,
                   char (*args_2) [8],int *args_3,char (*args_4) [4])

{
  size_type *psVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  string local_70;
  string local_50;
  
  StringBuilder<int>(&local_50,arg);
  StringBuilder<char[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
            (&local_70,args,args_1,args_2,args_3,args_4);
  uVar3 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    uVar3 = local_50.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar3 < local_70._M_string_length + local_50._M_string_length) {
    uVar3 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar3 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_50._M_string_length <= (ulong)uVar3) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_70,0,(char *)0x0,(ulong)local_50._M_dataplus._M_p);
      goto LAB_0013d0d3;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
LAB_0013d0d3:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar3 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}